

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<NBvh3::Node<NBvh3::KDop<16u>>const*,NBvh3::Node<NBvh3::KDop<16u>>const*>
          (internal *this,char *expected_expression,char *actual_expression,
          Node<NBvh3::KDop<16U>_> **expected,Node<NBvh3::KDop<16U>_> **actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar2;
  string local_70;
  string local_50;
  internal *local_30;
  Node<NBvh3::KDop<16U>_> **actual_local;
  Node<NBvh3::KDop<16U>_> **expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  local_30 = (internal *)actual;
  actual_local = expected;
  expected_local = (Node<NBvh3::KDop<16U>_> **)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  if (*expected == *actual) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<NBvh3::Node<NBvh3::KDop<16u>>const*,NBvh3::Node<NBvh3::KDop<16u>>const*>
              (&local_50,(internal *)expected,actual,actual);
    FormatForComparisonFailureMessage<NBvh3::Node<NBvh3::KDop<16u>>const*,NBvh3::Node<NBvh3::KDop<16u>>const*>
              (&local_70,local_30,actual_local,actual);
    EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar1.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}